

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

PerspectiveCamera *
pbrt::PerspectiveCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,Film *film,
          Medium *medium,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  Tuple2<pbrt::Point2,_int> this;
  Tuple2<pbrt::Point2,_int> __s;
  size_type sVar2;
  reference pvVar3;
  PerspectiveCamera *pPVar4;
  vector<float,_std::allocator<float>_> *in_RDI;
  Float FVar5;
  float fVar6;
  Float FVar7;
  Float fov;
  vector<float,_std::allocator<float>_> sw;
  Bounds2f screen;
  Float frame;
  Float focaldistance;
  Float lensradius;
  CameraBaseParameters cameraBaseParameters;
  string *in_stack_fffffffffffffa98;
  ParameterDictionary *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  Bounds2<float> *in_stack_fffffffffffffab0;
  Bounds2<float> *args_2;
  vector<float,_std::allocator<float>_> *args_1;
  CameraBaseParameters *args;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  char *in_stack_fffffffffffffad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  FileLoc *loc_00;
  ParameterDictionary *parameters_00;
  Medium *in_stack_fffffffffffffb48;
  Film *in_stack_fffffffffffffb50;
  CameraTransform *in_stack_fffffffffffffb58;
  CameraBaseParameters *in_stack_fffffffffffffb60;
  undefined1 local_479 [33];
  vector<float,_std::allocator<float>_> local_458;
  value_type local_43c;
  value_type local_438;
  value_type local_434;
  value_type local_430;
  Tuple2<pbrt::Point2,_int> local_42c;
  Tuple2<pbrt::Point2,_int> local_424;
  allocator<char> local_419;
  string local_418 [32];
  float local_3f8;
  allocator<char> local_3f1;
  string local_3f0 [32];
  Float local_3d0;
  allocator<char> local_3b9;
  string local_3b8 [36];
  Float local_394;
  undefined1 local_390 [896];
  vector<float,_std::allocator<float>_> *local_10;
  
  loc_00 = (FileLoc *)(local_390 + 8);
  local_10 = in_RDI;
  Film::Film((Film *)in_stack_fffffffffffffaa0,(Film *)in_stack_fffffffffffffa98);
  parameters_00 = (ParameterDictionary *)local_390;
  Medium::Medium((Medium *)in_stack_fffffffffffffaa0,(Medium *)in_stack_fffffffffffffa98);
  CameraBaseParameters::CameraBaseParameters
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48,parameters_00,loc_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,0.0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  local_394 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,0.0);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  local_3d0 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  this = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffa98);
  local_424.x = this.x;
  fVar6 = (float)local_424.x;
  local_424 = this;
  __s = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffa98);
  local_42c = __s;
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,0.0);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_419);
  local_3f8 = FVar5;
  Bounds2<float>::Bounds2(in_stack_fffffffffffffab0);
  if (local_3f8 <= 1.0) {
    local_43c = -1.0;
    local_434 = 1.0;
    local_438 = -1.0 / local_3f8;
    local_430 = 1.0 / local_3f8;
  }
  else {
    local_43c = -local_3f8;
    local_434 = local_3f8;
    local_438 = -1.0;
    local_430 = 1.0;
  }
  args = (CameraBaseParameters *)local_479;
  args_1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             (allocator<char> *)CONCAT44(fVar6,FVar5));
  ParameterDictionary::GetFloatArray
            ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
             (string *)in_stack_fffffffffffffaa0);
  std::__cxx11::string::~string((string *)(local_479 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_479);
  bVar1 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffab0);
  if (!bVar1) {
    if ((*(byte *)(Options + 0xd) & 1) == 0) {
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_458);
      if (sVar2 == 4) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,0);
        local_43c = *pvVar3;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,1);
        local_434 = *pvVar3;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,2);
        local_438 = *pvVar3;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,3);
        local_430 = *pvVar3;
      }
      else {
        Error((FileLoc *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      }
    }
    else {
      Warning<>((char *)CONCAT44(fVar6,FVar5));
    }
  }
  args_2 = (Bounds2<float> *)&stack0xfffffffffffffb5f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             (allocator<char> *)CONCAT44(fVar6,FVar5));
  FVar7 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,0.0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb5f);
  pPVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::PerspectiveCamera,pbrt::CameraBaseParameters&,float&,pbrt::Bounds2<float>&,float&,float&>
                     ((polymorphic_allocator<std::byte> *)CONCAT44(fVar6,FVar5),args,(float *)args_1
                      ,args_2,(float *)local_10,(float *)CONCAT44(FVar7,in_stack_fffffffffffffaa8));
  std::vector<float,_std::allocator<float>_>::~vector(local_10);
  return pPVar4;
}

Assistant:

PerspectiveCamera *PerspectiveCamera::Create(const ParameterDictionary &parameters,
                                             const CameraTransform &cameraTransform,
                                             Film film, Medium medium, const FileLoc *loc,
                                             Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    Float lensradius = parameters.GetOneFloat("lensradius", 0.f);
    Float focaldistance = parameters.GetOneFloat("focaldistance", 1e6);
    Float frame =
        parameters.GetOneFloat("frameaspectratio", Float(film.FullResolution().x) /
                                                       Float(film.FullResolution().y));
    Bounds2f screen;
    if (frame > 1.f) {
        screen.pMin.x = -frame;
        screen.pMax.x = frame;
        screen.pMin.y = -1.f;
        screen.pMax.y = 1.f;
    } else {
        screen.pMin.x = -1.f;
        screen.pMax.x = 1.f;
        screen.pMin.y = -1.f / frame;
        screen.pMax.y = 1.f / frame;
    }
    std::vector<Float> sw = parameters.GetFloatArray("screenwindow");
    if (!sw.empty()) {
        if (Options->fullscreen) {
                Warning("\"screenwindow\" is ignored in fullscreen mode");
        } else {
            if (sw.size() == 4) {
                screen.pMin.x = sw[0];
                screen.pMax.x = sw[1];
                screen.pMin.y = sw[2];
                screen.pMax.y = sw[3];
            } else {
                Error(loc, "\"screenwindow\" should have four values");
            }
        }
    }
    Float fov = parameters.GetOneFloat("fov", 90.);
    return alloc.new_object<PerspectiveCamera>(cameraBaseParameters, fov, screen,
                                               lensradius, focaldistance);
}